

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_SkipObj_Test::~NLReaderTest_SkipObj_Test(NLReaderTest_SkipObj_Test *this)

{
  void *in_RDI;
  
  ~NLReaderTest_SkipObj_Test((NLReaderTest_SkipObj_Test *)0x1a5a68);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(NLReaderTest, SkipObj) {
  testing::NiceMock<MockNLHandler> handler;
  EXPECT_CALL(handler, NeedObj(0)).WillOnce(Return(false));
  EXPECT_CALL(handler, OnLinearObjExpr(_, _)).Times(0);
  auto header = NLHeader();
  header.num_vars = header.num_objs = 1;
  ReadNLString(FormatHeader(header) + "G0 1\n0 1\n", handler);
}